

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::FunctionReturnTypeEvaluator::checkCompoundBin
          (FunctionReturnTypeEvaluator *this,BinExpr *expr)

{
  uint uVar1;
  uint uVar2;
  TreeOp TVar3;
  BinExpr *in_RSI;
  long in_RDI;
  bool hasFuncCall;
  uint rhsFlags;
  uint lhsFlags;
  uint old;
  TreeOp op;
  undefined4 uVar4;
  
  TVar3 = Node::op((Node *)in_RSI);
  uVar4 = *(undefined4 *)(in_RDI + 8);
  *(undefined4 *)(in_RDI + 8) = 0;
  BinExpr::lhs(in_RSI);
  checkExpr((FunctionReturnTypeEvaluator *)in_RSI,(Expr *)CONCAT44(TVar3,uVar4));
  uVar1 = *(uint *)(in_RDI + 8);
  *(undefined4 *)(in_RDI + 8) = 0;
  BinExpr::rhs(in_RSI);
  checkExpr((FunctionReturnTypeEvaluator *)in_RSI,(Expr *)CONCAT44(TVar3,uVar4));
  uVar2 = *(uint *)(in_RDI + 8);
  *(undefined4 *)(in_RDI + 8) = uVar4;
  if ((TVar3 == TO_NULLC) ||
     ((((uVar1 & 4) == 0 || ((uVar2 & 8) == 0)) && (((uVar2 & 4) == 0 || ((uVar1 & 8) == 0)))))) {
    if ((uVar2 & 2) == 0) {
      if (((uVar1 & 0xfffffcff | uVar2 & 0xfffffcff) & 0x10) == 0) {
        *(uint *)(in_RDI + 8) = uVar2 & 0xfffffcff | *(uint *)(in_RDI + 8);
      }
      else {
        *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 0x10;
      }
    }
    else {
      *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 2;
    }
  }
  else {
    *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 4;
  }
  if (((uVar1 & 0xfffffdff | uVar2 & 0xfffffdff) & 0x100) != 0) {
    *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 0x100;
  }
  return;
}

Assistant:

void FunctionReturnTypeEvaluator::checkCompoundBin(const BinExpr *expr) {
  enum TreeOp op = expr->op();

  assert(op == TO_ANDAND || op == TO_OROR || op == TO_NULLC);

  unsigned old = flags;
  flags = 0;

  checkExpr(expr->lhs());

  unsigned lhsFlags = flags;
  flags = 0;

  checkExpr(expr->rhs());

  unsigned rhsFlags = flags;
  flags = old;

  lhsFlags &= ~RT_UNRECOGNIZED;
  rhsFlags &= ~RT_UNRECOGNIZED;

  bool hasFuncCall = (lhsFlags | rhsFlags) & RT_FUNCTION_CALL;

  lhsFlags &= ~RT_FUNCTION_CALL;
  rhsFlags &= ~RT_FUNCTION_CALL;

  if (op != TO_NULLC && (((lhsFlags & RT_BOOL) && (rhsFlags & RT_NUMBER)) || ((rhsFlags & RT_BOOL) && (lhsFlags & RT_NUMBER))))
    flags |= RT_BOOL;
  else if (rhsFlags & RT_NULL)
    flags |= RT_NULL;
  else if ((lhsFlags | rhsFlags) & RT_STRING)
    flags |= RT_STRING;
  else
    flags |= rhsFlags;

  if (hasFuncCall)
    flags |= RT_FUNCTION_CALL;
}